

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

void __thiscall player_t::TickPSprites(player_t *this)

{
  APlayerPawn *pAVar1;
  AWeapon *pAVar2;
  DBot *pDVar3;
  DPSprite *this_00;
  PClass *pPVar4;
  int iVar5;
  undefined8 in_RAX;
  undefined4 extraout_var;
  AActor *pAVar6;
  undefined4 extraout_var_00;
  PClass *pPVar7;
  undefined4 extraout_var_01;
  DPSprite *pDVar8;
  AWeapon *pAVar9;
  APlayerPawn *pAVar10;
  long lVar11;
  bool bVar12;
  undefined8 uStack_38;
  
  pDVar8 = (this->psprites).field_0.p;
  uStack_38 = in_RAX;
  if ((pDVar8 != (DPSprite *)0x0) && (((pDVar8->super_DObject).ObjectFlags & 0x20) != 0)) {
    (this->psprites).field_0.p = (DPSprite *)0x0;
    pDVar8 = (DPSprite *)0x0;
  }
  while (this_00 = pDVar8, this_00 != (DPSprite *)0x0) {
    pAVar6 = (this_00->Caller).field_0.p;
    if (pAVar6 == (AActor *)0x0) {
LAB_0052d6f6:
      (*(this_00->super_DObject)._vptr_DObject[4])(this_00);
    }
    else {
      if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (this_00->Caller).field_0.p = (AActor *)0x0;
        goto LAB_0052d6f6;
      }
      pAVar6 = (this_00->Caller).field_0.p;
      if ((pAVar6 != (AActor *)0x0) &&
         (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (this_00->Caller).field_0.p = (AActor *)0x0;
        pAVar6 = (AActor *)0x0;
      }
      pPVar4 = AInventory::RegistrationInfo.MyClass;
      if ((pAVar6->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(pAVar6->super_DThinker).super_DObject._vptr_DObject)(pAVar6);
        (pAVar6->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar7 = (pAVar6->super_DThinker).super_DObject.Class;
      bVar12 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar4 && bVar12) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar12 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (bVar12) {
        pAVar6 = (this_00->Caller).field_0.p;
        if ((pAVar6 != (AActor *)0x0) &&
           (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (this_00->Caller).field_0.p = (AActor *)0x0;
          pAVar6 = (AActor *)0x0;
        }
        pAVar1 = this_00->Owner->mo;
        pAVar10 = (APlayerPawn *)pAVar6[1].super_DThinker.super_DObject._vptr_DObject;
        if ((pAVar10 != (APlayerPawn *)0x0) &&
           (((pAVar10->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
          pAVar6[1].super_DThinker.super_DObject._vptr_DObject = (_func_int **)0x0;
          pAVar10 = (APlayerPawn *)0x0;
        }
        if (pAVar10 != pAVar1) goto LAB_0052d6f6;
      }
      pAVar6 = (this_00->Caller).field_0.p;
      if ((pAVar6 != (AActor *)0x0) &&
         (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (this_00->Caller).field_0.p = (AActor *)0x0;
        pAVar6 = (AActor *)0x0;
      }
      pPVar4 = AWeapon::RegistrationInfo.MyClass;
      if ((pAVar6->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(pAVar6->super_DThinker).super_DObject._vptr_DObject)(pAVar6);
        (pAVar6->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar5);
      }
      pPVar7 = (pAVar6->super_DThinker).super_DObject.Class;
      bVar12 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar4 && bVar12) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar12 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (bVar12) {
        pAVar9 = (AWeapon *)(this_00->Caller).field_0.p;
        pAVar2 = this_00->Owner->ReadyWeapon;
        if ((pAVar9 != (AWeapon *)0x0) &&
           (((pAVar9->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20
            ) != 0)) {
          (this_00->Caller).field_0.p = (AActor *)0x0;
          pAVar9 = (AWeapon *)0x0;
        }
        if (pAVar9 != pAVar2) goto LAB_0052d6f6;
      }
      DPSprite::Tick(this_00);
    }
    pDVar8 = (this_00->Next).field_0.p;
    if ((pDVar8 != (DPSprite *)0x0) && (((pDVar8->super_DObject).ObjectFlags & 0x20) != 0)) {
      (this_00->Next).field_0.p = (DPSprite *)0x0;
      pDVar8 = (DPSprite *)0x0;
    }
  }
  if (this->health < 1) {
    if (this->ReadyWeapon == (AWeapon *)0x0) {
      return;
    }
    if (((this->ReadyWeapon->super_AInventory).field_0x4de & 4) != 0) {
      return;
    }
  }
  if (this->ReadyWeapon == (AWeapon *)0x0) {
    if (this->PendingWeapon == (AWeapon *)0xffffffffffffffff) {
      return;
    }
    P_BringUpWeapon(this);
    return;
  }
  P_CheckWeaponSwitch(this);
  if ((this->WeaponState & 5) != 0) {
    P_CheckWeaponFire(this);
  }
  pDVar3 = (this->Bot).field_0.p;
  if (pDVar3 != (DBot *)0x0) {
    if (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0052d786;
    (this->Bot).field_0.p = (DBot *)0x0;
  }
  if (bot_observer.Value != false) {
    return;
  }
LAB_0052d786:
  pAVar9 = this->ReadyWeapon;
  if (pAVar9 != (AWeapon *)0x0) {
    lVar11 = 0xc;
    do {
      if (((*(uint *)(&UNK_00740f28 + lVar11) & (uint)this->WeaponState) != 0) &&
         (((this->cmd).ucmd.buttons & *(uint *)(&UNK_00740f2c + lVar11)) != 0)) {
        uStack_38 = CONCAT44(*(undefined4 *)((long)&ButtonChecks[0].ReadyFlag + lVar11),
                             (undefined4)uStack_38);
        iVar5 = (*(pAVar9->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject
                  [0x49])(pAVar9,(long)&uStack_38 + 4);
        if ((FState *)CONCAT44(extraout_var_01,iVar5) != (FState *)0x0) {
          pDVar8 = GetPSprite(this,PSP_WEAPON);
          DPSprite::SetState(pDVar8,(FState *)CONCAT44(extraout_var_01,iVar5),false);
          return;
        }
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x6c);
  }
  return;
}

Assistant:

void player_t::TickPSprites()
{
	DPSprite *pspr = psprites;
	while (pspr)
	{
		// Destroy the psprite if it's from a weapon that isn't currently selected by the player
		// or if it's from an inventory item that the player no longer owns. 
		if ((pspr->Caller == nullptr ||
			(pspr->Caller->IsKindOf(RUNTIME_CLASS(AInventory)) && barrier_cast<AInventory *>(pspr->Caller)->Owner != pspr->Owner->mo) ||
			(pspr->Caller->IsKindOf(RUNTIME_CLASS(AWeapon)) && pspr->Caller != pspr->Owner->ReadyWeapon)))
		{
			pspr->Destroy();
		}
		else
		{
			pspr->Tick();
		}

		pspr = pspr->Next;
	}

	if ((health > 0) || (ReadyWeapon != nullptr && !(ReadyWeapon->WeaponFlags & WIF_NODEATHINPUT)))
	{
		if (ReadyWeapon == nullptr)
		{
			if (PendingWeapon != WP_NOCHANGE)
				P_BringUpWeapon(this);
		}
		else
		{
			P_CheckWeaponSwitch(this);
			if (WeaponState & (WF_WEAPONREADY | WF_WEAPONREADYALT))
			{
				P_CheckWeaponFire(this);
			}
			// Check custom buttons
			P_CheckWeaponButtons(this);
		}
	}
}